

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_point.cpp
# Opt level: O1

int metaNewIndex(lua_State *L)

{
  uint uVar1;
  Arena<Variable> *this;
  int iVar2;
  uint *puVar3;
  char *pcVar4;
  char *pcVar5;
  Variable *pVVar6;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> id_01;
  Idx<Variable> id_02;
  string k;
  allocator local_51;
  double local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  puVar3 = (uint *)(*lua_touserdata)(L,1);
  uVar1 = *puVar3;
  this = *(Arena<Variable> **)(puVar3 + 2);
  pcVar4 = (*lua_tolstring)(L,2,(size_t *)0x0);
  std::__cxx11::string::string((string *)local_48,pcVar4,&local_51);
  iVar2 = std::__cxx11::string::compare((char *)local_48);
  if (iVar2 == 0) {
    pcVar5 = (*lua_tolstring)(L,3,(size_t *)0x0);
    id_00._4_4_ = 0;
    id_00.Raw = uVar1;
    id_00._arena = this;
    pVVar6 = Arena<Variable>::Index(this,id_00);
    pcVar4 = "";
    if (pcVar5 != (char *)0x0) {
      pcVar4 = pcVar5;
    }
    pcVar5 = (char *)(pVVar6->name)._M_string_length;
    strlen(pcVar4);
    std::__cxx11::string::_M_replace((ulong)&pVVar6->name,0,pcVar5,(ulong)pcVar4);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)local_48);
    if (iVar2 == 0) {
      pcVar5 = (*lua_tolstring)(L,3,(size_t *)0x0);
      id_01._4_4_ = 0;
      id_01.Raw = uVar1;
      id_01._arena = this;
      pVVar6 = Arena<Variable>::Index(this,id_01);
      pcVar4 = "";
      if (pcVar5 != (char *)0x0) {
        pcVar4 = pcVar5;
      }
      pcVar5 = (char *)(pVVar6->value)._M_string_length;
      strlen(pcVar4);
      std::__cxx11::string::_M_replace((ulong)&pVVar6->value,0,pcVar5,(ulong)pcVar4);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_48);
      if (iVar2 == 0) {
        local_50 = lua_tonumber(L,3);
        id_02._4_4_ = 0;
        id_02.Raw = uVar1;
        id_02._arena = this;
        pVVar6 = Arena<Variable>::Index(this,id_02);
        pVVar6->valueType = (int)local_50;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_48);
        if (iVar2 == 0) {
          pcVar5 = (*lua_tolstring)(L,3,(size_t *)0x0);
          id._4_4_ = 0;
          id.Raw = uVar1;
          id._arena = this;
          pVVar6 = Arena<Variable>::Index(this,id);
          pcVar4 = "";
          if (pcVar5 != (char *)0x0) {
            pcVar4 = pcVar5;
          }
          pcVar5 = (char *)(pVVar6->valueTypeName)._M_string_length;
          strlen(pcVar4);
          std::__cxx11::string::_M_replace((ulong)&pVVar6->valueTypeName,0,pcVar5,(ulong)pcVar4);
        }
      }
    }
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  return 0;
}

Assistant:

int metaNewIndex(lua_State* L)
{
	auto* pVar = (Idx<Variable>*)lua_touserdata(L, 1);
	auto var = *pVar;
	const std::string k = lua_tostring(L, 2);
	if (k == "name")
	{
		const char* value = lua_tostring(L, 3);
		var->name = value ? value : "";
	}
	else if (k == "value")
	{
		const char* value = lua_tostring(L, 3);
		var->value = value ? value : "";
	}
	else if (k == "valueType")
	{
		var->valueType = static_cast<int>(lua_tonumber(L, 3));
	}
	else if (k == "valueTypeName")
	{
		const char* value = lua_tostring(L, 3);
		var->valueTypeName = value ? value : "";
	}
	return 0;
}